

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

void __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::dump
          (Element_variable *this,ostream *os,Dump_state *state)

{
  ulong uVar1;
  
  if (state->indent_depth != 0) {
    uVar1 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
      uVar1 = uVar1 + 1;
    } while (uVar1 < state->indent_depth);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(this->matrix_variable->name)._M_dataplus._M_p,
             (this->matrix_variable->name)._M_string_length);
  write_indexes(this,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

virtual void dump(std::ostream &os, Dump_state &state) const override
    {
        state.write_indent(os);
        os << matrix_variable->name;
        write_indexes(os);
        os << "\n";
    }